

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void Abc_NtkMarkFanouts_rec(Abc_Obj_t *pLut,int nLevMax,int nFanMax)

{
  int iVar1;
  long lVar2;
  
  if (((((*(uint *)&pLut->field_0x14 & 0xf) == 7) &&
       (iVar1 = Abc_NodeIsTravIdCurrent(pLut), iVar1 == 0)) &&
      (Abc_NodeSetTravIdCurrent(pLut), (int)(*(uint *)&pLut->field_0x14 >> 0xc) <= nLevMax)) &&
     (iVar1 = (pLut->vFanouts).nSize, iVar1 <= nFanMax)) {
    for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      Abc_NtkMarkFanouts_rec
                ((Abc_Obj_t *)pLut->pNtk->vObjs->pArray[(pLut->vFanouts).pArray[lVar2]],nLevMax,
                 nFanMax);
      iVar1 = (pLut->vFanouts).nSize;
    }
  }
  return;
}

Assistant:

static inline int         Abc_ObjIsNode( Abc_Obj_t * pObj )          { return pObj->Type == ABC_OBJ_NODE;    }